

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void getCellInfo(BtCursor *pCur)

{
  MemPage *pMVar1;
  
  if ((pCur->info).nSize != 0) {
    return;
  }
  pCur->curFlags = pCur->curFlags | 2;
  pMVar1 = pCur->apPage[pCur->iPage];
  (*pMVar1->xParseCell)
            (pMVar1,pMVar1->aData +
                    (CONCAT11(pMVar1->aCellIdx[(ulong)pCur->ix * 2],
                              pMVar1->aCellIdx[(ulong)pCur->ix * 2 + 1]) & pMVar1->maskPage),
             &pCur->info);
  return;
}

Assistant:

static SQLITE_NOINLINE void getCellInfo(BtCursor *pCur){
  if( pCur->info.nSize==0 ){
    int iPage = pCur->iPage;
    pCur->curFlags |= BTCF_ValidNKey;
    btreeParseCell(pCur->apPage[iPage],pCur->ix,&pCur->info);
  }else{
    assertCellInfo(pCur);
  }
}